

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

void CTPNCodeBodyBase::unref_label_cb(void *param_1,CTcSymbol *sym)

{
  CTPNStmBase *this;
  
  if (((*(int *)&(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.field_0x24 == 8)
      && (this = (CTPNStmBase *)
                 sym[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
                 _vptr_CVmHashEntry, this != (CTPNStmBase *)0x0)) &&
     ((this[1].linenum_ & 0x70) == 0)) {
    CTPNStmBase::log_warning
              (this,0x2d0c,
               (ulong)(uint)(sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.len_,
               (sym->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.str_);
    return;
  }
  return;
}

Assistant:

void CTPNCodeBodyBase::unref_label_cb(void *, CTcSymbol *sym)
{
    /* if it's a label, check it out */
    if (sym->get_type() == TC_SYM_LABEL)
    {
        CTcSymLabel *lbl = (CTcSymLabel *)sym;

        /* 
         *   get its underlying statement, and make sure it has a
         *   control-flow flag for goto, continue, or break 
         */
        if (lbl->get_stm() != 0)
        {
            ulong flags;

            /* 
             *   get the explicit control flow flags for this statement --
             *   these flags indicate the use of the label in a goto,
             *   break, or continue statement 
             */
            flags = lbl->get_stm()->get_explicit_control_flow_flags();

            /* 
             *   if the flags aren't set for at least one of the explicit
             *   label uses, the label is unreferenced 
             */
            if ((flags & (TCPRS_FLOW_GOTO | TCPRS_FLOW_BREAK
                          | TCPRS_FLOW_CONT)) == 0)
                lbl->get_stm()->log_warning(TCERR_UNREFERENCED_LABEL,
                                            (int)lbl->get_sym_len(),
                                            lbl->get_sym());
        }
    }
}